

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

decimal_fp<float> fmt::v11::detail::dragonbox::to_decimal<float>(float x)

{
  undefined1 auVar1 [16];
  compute_mul_parity_result cVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  decimal_fp<float> dVar14;
  cache_entry_type cache;
  ulong local_40;
  ulong local_38;
  
  uVar5 = (uint)x & 0x7fffff;
  uVar6 = (uint)x >> 0x17 & 0xff;
  if (uVar6 == 0) {
    iVar7 = -0x95;
    if (uVar5 == 0) {
      dVar14.significand = 0;
      dVar14.exponent = 0;
      uVar9 = 0;
      goto LAB_001da3c5;
    }
  }
  else {
    iVar7 = uVar6 - 0x96;
    if (uVar5 == 0) {
      dVar14 = shorter_interval_case<float>(iVar7);
      uVar9 = (ulong)dVar14 >> 0x20;
      goto LAB_001da3c5;
    }
    uVar5 = uVar5 | 0x800000;
  }
  uVar8 = iVar7 * 0x4d105 >> 0x14;
  uVar9 = (ulong)uVar8;
  local_40 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                       (ulong)(0x20 - uVar8) * 8);
  iVar7 = ((int)((1 - uVar8) * 0x1a934f) >> 0x13) + iVar7;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_40;
  auVar1 = (ZEXT416(uVar5 * 2 + 1 << ((byte)iVar7 & 0x1f)) << 0x20) * auVar1;
  uVar4 = auVar1._8_8_;
  uVar3 = uVar4 >> 0x20;
  iVar11 = (int)(uVar3 / 100);
  uVar6 = (uint)(uVar3 / 100);
  iVar10 = (int)(uVar3 / 100);
  uVar13 = iVar10 * -100 + auVar1._12_4_;
  uVar12 = (uint)(local_40 >> (~(byte)iVar7 & 0x3f));
  if (uVar13 < uVar12) {
    if (((uVar13 != 0) || (((uint)x & 1) == 0)) ||
       ((auVar1 & (undefined1  [16])0xffffffff) != (undefined1  [16])0x0)) {
LAB_001da2ec:
      if ((uint)(uVar4 >> 0x22) < 0x19) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                    ,0x482,"");
      }
      iVar7 = (int)(uVar3 / 100);
      uVar5 = iVar7 * 0x40000000 | (uint)(iVar7 * -0x3d70a3d7) >> 2;
      uVar13 = 0;
      if (uVar5 < 0x28f5c29) {
        uVar13 = 0;
        do {
          uVar6 = uVar5;
          uVar13 = uVar13 + 2;
          uVar5 = uVar6 * 0x40000000 | uVar6 * -0x3d70a3d7 >> 2;
        } while (uVar5 < 0x28f5c29);
      }
      uVar12 = uVar6 * -0x33333333 >> 1 | (uint)((uVar6 * -0x33333333 & 1) != 0) << 0x1f;
      uVar5 = uVar12;
      if (uVar12 >= 0x1999999a) {
        uVar5 = uVar6;
      }
      dVar14.exponent = 0;
      dVar14.significand = uVar5;
      uVar9 = (ulong)(uVar8 + 1 + (uVar12 < 0x1999999a | uVar13));
      goto LAB_001da3c5;
    }
    iVar11 = iVar10 + -1;
    uVar13 = 100;
  }
  else if (uVar13 <= uVar12) {
    local_38 = uVar4;
    cVar2 = cache_accessor<float>::compute_mul_parity(uVar5 * 2 - 1,&local_40,iVar7);
    uVar4 = local_38;
    if ((~uVar5 & (uint)((ushort)cVar2 >> 8) & 1) != 0 || ((ushort)cVar2 & 1) != 0)
    goto LAB_001da2ec;
  }
  uVar13 = uVar13 - (uVar12 >> 1);
  uVar6 = uVar13 + 5;
  if (100 < uVar6) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                ,0xed,"n is too large");
  }
  uVar6 = uVar6 * 0x199a;
  uVar12 = uVar6 >> 0x10;
  uVar8 = uVar12 + iVar11 * 10;
  dVar14.exponent = 0;
  dVar14.significand = uVar8;
  if ((uVar6 & 0xffff) < 0x199a) {
    cVar2 = cache_accessor<float>::compute_mul_parity(uVar5 * 2,&local_40,iVar7);
    if ((uVar13 & 1) == ((ushort)cVar2 & 1)) {
      dVar14.significand = uVar8 - (uVar12 & (ushort)cVar2 >> 8 & 1);
      dVar14.exponent = 0;
    }
    else {
      dVar14.significand = uVar8 - 1;
      dVar14.exponent = 0;
    }
  }
LAB_001da3c5:
  return (decimal_fp<float>)((ulong)dVar14 & 0xffffffff | uVar9 << 0x20);
}

Assistant:

auto small_division_by_pow10(uint32_t n) noexcept -> uint32_t {
  constexpr auto info = div_small_pow10_infos[N - 1];
  FMT_ASSERT(n <= info.divisor * 10, "n is too large");
  constexpr uint32_t magic_number =
      (1u << info.shift_amount) / info.divisor + 1;
  return (n * magic_number) >> info.shift_amount;
}